

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

hwaddr cpu_mips_translate_address_mips(CPUMIPSState *env,target_ulong_conflict address,int rw)

{
  int tlb_error;
  hwaddr hVar1;
  uint access_type;
  hwaddr physical;
  int prot;
  int in_stack_ffffffffffffffd8;
  undefined4 uStack_24;
  int local_1c;
  
  access_type = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    access_type = env->hflags & 3;
  }
  tlb_error = get_physical_address
                        (env,(hwaddr *)&stack0xffffffffffffffd8,&local_1c,address,rw,access_type,
                         in_stack_ffffffffffffffd8);
  if (tlb_error == 0) {
    hVar1 = CONCAT44(uStack_24,in_stack_ffffffffffffffd8);
  }
  else {
    raise_mmu_exception(env,address,rw,tlb_error);
    hVar1 = 0xffffffffffffffff;
  }
  return hVar1;
}

Assistant:

hwaddr cpu_mips_translate_address(CPUMIPSState *env, target_ulong address,
                                  int rw)
{
    hwaddr physical;
    int prot;
    int access_type;
    int ret = 0;

    /* data access */
    access_type = ACCESS_INT;
    ret = get_physical_address(env, &physical, &prot, address, rw, access_type,
                               cpu_mmu_index(env, false));
    if (ret != TLBRET_MATCH) {
        raise_mmu_exception(env, address, rw, ret);
        return -1LL;
    } else {
        return physical;
    }
}